

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolact.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  vector<Object,_std::allocator<Object>_> *objects_00;
  pointer *ppfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  byte bVar8;
  undefined2 uVar9;
  char *pcVar10;
  undefined1 auVar11 [16];
  double dVar12;
  int *piVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [12];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  pointer piVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  char cVar29;
  int iVar30;
  long lVar31;
  float *pfVar32;
  size_t sVar33;
  ulong uVar34;
  uint uVar35;
  byte *pbVar36;
  uint uVar37;
  ulong uVar38;
  long lVar39;
  int iVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  float *mp;
  pointer pOVar44;
  int j;
  int iVar45;
  long lVar46;
  size_type sVar47;
  pointer pOVar48;
  pointer pOVar49;
  int iVar50;
  ulong uVar51;
  bool bVar52;
  undefined2 uVar95;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  pointer pfVar58;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar75 [12];
  undefined1 auVar76 [12];
  undefined1 auVar72 [16];
  __m128d t;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 uVar79;
  undefined1 uVar80;
  undefined1 uVar81;
  undefined1 uVar82;
  undefined1 uVar83;
  undefined1 uVar84;
  undefined1 uVar85;
  undefined1 uVar86;
  undefined1 uVar87;
  undefined1 uVar88;
  undefined1 uVar89;
  float fVar90;
  float fVar94;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  vector<Object,_std::allocator<Object>_> objects;
  Extractor ex;
  vector<int,_std::allocator<int>_> picked;
  long *local_4d0;
  Mat local_4b8;
  ulong local_468;
  size_type local_460;
  ulong local_458;
  int local_450;
  int local_44c;
  Mat local_448;
  undefined1 local_3f8 [8];
  vector<float,_std::allocator<float>_> *pvStack_3f0;
  undefined1 local_3e8 [5] [16];
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  class_candidates;
  Mat local_378;
  Size label_size;
  Mat local_2d8;
  int baseLine;
  int iStack_284;
  undefined4 uStack_280;
  int iStack_27c;
  size_t local_278;
  int iStack_270;
  Allocator *local_268;
  int iStack_260;
  int iStack_25c;
  size_t sStack_258;
  int local_250;
  size_t local_248;
  ulong local_238;
  long local_230;
  vector<float,_std::allocator<float>_> areas;
  Mat local_1f8 [216];
  undefined4 local_120 [2];
  undefined1 local_118 [16];
  Net yolact;
  Mat m;
  uint local_a8;
  uint uStack_a4;
  uchar *local_a0;
  float norm_vals [3];
  float mean_vals [3];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar73 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar74 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar63 [16];
  
  if (argc == 2) {
    pcVar10 = argv[1];
    std::__cxx11::string::string((string *)&areas,pcVar10,(allocator *)&picked);
    cv::imread((string *)&m,(int)&areas);
    if ((pointer *)
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    cVar29 = cv::Mat::empty();
    if (cVar29 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _0_12_ = ZEXT812(0);
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&yolact);
      yolact.opt.use_vulkan_compute = true;
      iVar30 = ncnn::Net::load_param(&yolact,"yolact.param");
      if ((iVar30 != 0) || (iVar30 = ncnn::Net::load_model(&yolact,"yolact.bin"), iVar30 != 0)) {
        exit(-1);
      }
      local_458 = (ulong)uStack_a4;
      ncnn::Mat::from_pixels_resize
                (&local_448,local_a0,0x10002,uStack_a4,local_a8,0x226,0x226,(Allocator *)0x0);
      mean_vals[0] = 123.68;
      mean_vals[1] = 116.78;
      mean_vals[2] = 103.94;
      norm_vals[0] = 0.017123288;
      norm_vals[1] = 0.017507004;
      norm_vals[2] = 0.017427675;
      ncnn::Mat::substract_mean_normalize(&local_448,mean_vals,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"input.1",&local_448);
      local_4b8.cstep = 0;
      local_4b8.data._0_4_ = 0;
      local_4b8.data._4_4_ = 0;
      local_4b8.refcount._0_4_ = 0;
      local_4b8.elemsize = SUB128(ZEXT812(0),4);
      local_4b8.elempack = 0;
      local_4b8.allocator = (Allocator *)0x0;
      local_4b8.dims = 0;
      local_4b8.d = 0;
      local_4b8.c = 0;
      local_2d8.cstep = 0;
      local_2d8.refcount._0_4_ = 0;
      local_2d8.elempack = 0;
      local_2d8.allocator = (Allocator *)0x0;
      local_2d8.dims = 0;
      local_2d8.c = 0;
      local_378.cstep = 0;
      local_378.refcount._0_4_ = 0;
      local_378.elempack = 0;
      local_378.allocator = (Allocator *)0x0;
      local_378.dims = 0;
      local_378.d = 0;
      local_378.c = 0;
      local_4b8.refcount._4_4_ = (int)local_4b8.data;
      local_4b8.w = (int)local_4b8.data;
      local_4b8.h = local_4b8.data._4_4_;
      local_378.data._0_4_ = (int)local_4b8.data;
      local_378.data._4_4_ = local_4b8.data._4_4_;
      local_378.refcount._4_4_ = (int)local_4b8.data;
      local_378.elemsize = local_4b8.elemsize;
      local_378.w = (int)local_4b8.data;
      local_378.h = local_4b8.data._4_4_;
      label_size.width = (int)local_4b8.data;
      label_size.height = local_4b8.data._4_4_;
      local_2d8.data._0_4_ = (int)local_4b8.data;
      local_2d8.data._4_4_ = local_4b8.data._4_4_;
      local_2d8.refcount._4_4_ = (int)local_4b8.data;
      local_2d8.elemsize = local_4b8.elemsize;
      local_2d8.w = (int)local_4b8.data;
      local_2d8._48_8_ = local_4b8.elemsize;
      ncnn::Extractor::extract(&ex,"619",&local_4b8,0);
      ncnn::Extractor::extract(&ex,"816",&local_2d8,0);
      ncnn::Extractor::extract(&ex,"818",(Mat *)&label_size,0);
      ncnn::Extractor::extract(&ex,"820",&local_378,0);
      local_460 = (size_type)local_378.w;
      local_468 = (ulong)(uint)local_378.h;
      local_248 = 0;
      baseLine = 0;
      iStack_284 = 0;
      uStack_280 = 0;
      local_278 = SUB128(ZEXT812(0),4);
      iStack_270 = 0;
      local_268 = (Allocator *)0x0;
      iStack_260 = 0;
      local_250 = 0;
      iStack_27c = baseLine;
      iStack_25c = baseLine;
      sStack_258 = local_278;
      local_238 = (ulong)local_a8;
      ncnn::Mat::create((Mat *)&baseLine,4,local_378.h,4,(Allocator *)0x0);
      pfVar32 = (float *)CONCAT44(iStack_284,baseLine);
      lVar31 = 0;
      do {
        fVar57 = (float)(&DAT_005f1470)[lVar31];
        iVar30 = (&DAT_005f1450)[lVar31];
        fVar53 = (float)iVar30;
        if (iVar30 < 2) {
          iVar30 = 1;
        }
        iVar40 = 0;
        local_230 = lVar31;
        do {
          iVar45 = 0;
          do {
            lVar31 = 0;
            do {
              fVar54 = *(float *)((long)&DAT_005f1464 + lVar31);
              if (fVar54 < 0.0) {
                fVar54 = sqrtf(fVar54);
              }
              else {
                fVar54 = SQRT(fVar54);
              }
              sVar47 = local_460;
              fVar54 = (fVar54 * fVar57) / 550.0;
              *pfVar32 = ((float)iVar45 + 0.5) / fVar53;
              pfVar32[1] = ((float)iVar40 + 0.5) / fVar53;
              pfVar32[2] = fVar54;
              pfVar32[3] = fVar54;
              pfVar32 = pfVar32 + 4;
              bVar52 = lVar31 != 8;
              lVar31 = lVar31 + 4;
            } while (bVar52);
            iVar45 = iVar45 + 1;
          } while (iVar45 != iVar30);
          iVar40 = iVar40 + 1;
        } while (iVar40 != iVar30);
        lVar31 = local_230 + 1;
      } while (local_230 != 4);
      class_candidates.
      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ._M_impl.super__Vector_impl_data._0_12_ = ZEXT812(0);
      class_candidates.
      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      class_candidates.
      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ::resize(&class_candidates,local_460);
      if (0 < (int)local_468) {
        uVar38 = sVar47 & 0xffffffff;
        uVar42 = 0;
        uVar43 = local_468;
        do {
          fVar57 = 0.0;
          iVar30 = 0;
          if (1 < (int)sVar47) {
            fVar57 = 0.0;
            uVar51 = 0;
            uVar34 = 1;
            do {
              fVar53 = *(float *)(local_378.elemsize * uVar42 * (long)local_378.w +
                                  CONCAT44(local_378.data._4_4_,(int)local_378.data) + uVar34 * 4);
              if (fVar57 < fVar53) {
                uVar51 = uVar34 & 0xffffffff;
                fVar57 = fVar53;
              }
              iVar30 = (int)uVar51;
              uVar34 = uVar34 + 1;
            } while (uVar38 != uVar34);
          }
          if ((iVar30 != 0) && (0.05 < fVar57)) {
            lVar46 = (long)local_2d8.w * uVar42 * local_2d8.elemsize;
            lVar41 = (long)iStack_25c * uVar42 * local_278;
            pfVar32 = (float *)CONCAT44(label_size.height,label_size.width);
            lVar31 = CONCAT44(local_2d8.data._4_4_,(int)local_2d8.data);
            lVar39 = CONCAT44(iStack_284,baseLine);
            fVar55 = expf(*(float *)(lVar31 + 8 + lVar46) * 0.2);
            fVar56 = expf(*(float *)(lVar31 + 0xc + lVar46) * 0.2);
            uVar4 = *(undefined8 *)(lVar39 + lVar41);
            uVar5 = *(undefined8 *)(lVar39 + 8 + lVar41);
            fVar53 = (float)uVar5;
            fVar54 = (float)((ulong)uVar5 >> 0x20);
            fVar90 = (float)*(undefined8 *)(lVar31 + lVar46) * 0.1 * fVar53 + (float)uVar4;
            fVar94 = (float)((ulong)*(undefined8 *)(lVar31 + lVar46) >> 0x20) * 0.1 * fVar54 +
                     (float)((ulong)uVar4 >> 0x20);
            fVar53 = fVar55 * fVar53 * 0.5;
            fVar54 = fVar56 * fVar54 * 0.5;
            fVar55 = extraout_XMM0_Db * 0.0 * 0.0;
            fVar56 = extraout_XMM0_Db_00 * 0.0 * 0.0;
            auVar60._0_4_ = (fVar90 - fVar53) * (float)(int)uStack_a4;
            auVar60._4_4_ = (fVar94 - fVar54) * (float)(int)local_a8;
            auVar60._8_4_ = (0.0 - fVar55) * 0.0;
            auVar60._12_4_ = (0.0 - fVar56) * 0.0;
            auVar77._0_8_ = CONCAT44((float)(int)(local_a8 - 1),(float)(int)(uStack_a4 - 1));
            auVar77._8_4_ = 0xbf800000;
            auVar77._12_4_ = 0xbf800000;
            auVar91._8_4_ = 0xbf800000;
            auVar91._0_8_ = auVar77._0_8_;
            auVar91._12_4_ = 0xbf800000;
            auVar92 = minps(auVar91,auVar60);
            auVar59._0_12_ = ZEXT812(0);
            auVar59._12_4_ = 0;
            auVar60 = maxps(auVar59,auVar92);
            auVar92._4_4_ = (fVar54 + fVar94) * (float)(int)local_a8;
            auVar92._0_4_ = (fVar53 + fVar90) * (float)(int)uStack_a4;
            auVar92._8_4_ = (fVar55 + 0.0) * 0.0;
            auVar92._12_4_ = (fVar56 + 0.0) * 0.0;
            auVar92 = minps(auVar77,auVar92);
            auVar61._0_12_ = ZEXT812(0);
            auVar61._12_4_ = 0;
            auVar92 = maxps(auVar61,auVar92);
            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _0_12_ = ZEXT812(0);
            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish._4_4_ = 0;
            cv::Mat::Mat(local_1f8);
            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start = auVar60._0_8_;
            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish._4_4_ = (auVar92._4_4_ - auVar60._4_4_) + 1.0;
            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish._0_4_ = (auVar92._0_4_ - auVar60._0_4_) + 1.0;
            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)CONCAT44(fVar57,iVar30);
            std::vector<float,std::allocator<float>>::vector<float_const*,void>
                      ((vector<float,std::allocator<float>> *)&picked,pfVar32,pfVar32,
                       (allocator_type *)local_3f8);
            sVar47 = local_460;
            piVar23 = picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish._4_4_ = 0;
            picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish._0_4_ = 0;
            picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            std::vector<Object,_std::allocator<Object>_>::push_back
                      (class_candidates.
                       super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar30,(value_type *)&areas);
            cv::Mat::~Mat(local_1f8);
            uVar43 = local_468;
            if (piVar23 != (pointer)0x0) {
              operator_delete(piVar23);
              uVar43 = local_468;
            }
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar43);
      }
      std::vector<Object,_std::allocator<Object>_>::_M_erase_at_end
                (&objects,objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                          super__Vector_impl_data._M_start);
      if (0 < (int)((ulong)((long)class_candidates.
                                  super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)class_candidates.
                                 super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        lVar31 = 0;
        do {
          objects_00 = class_candidates.
                       super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar31;
          pOVar49 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pOVar44 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          if (pOVar49 != pOVar44) {
            qsort_descent_inplace
                      (objects_00,0,
                       (int)((ulong)((long)pOVar44 - (long)pOVar49) >> 4) * 0x38e38e39 + -1);
          }
          picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish._4_4_ = 0;
          picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish._0_4_ = 0;
          uVar37 = (int)((long)(objects_00->super__Vector_base<Object,_std::allocator<Object>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(objects_00->super__Vector_base<Object,_std::allocator<Object>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 4) * 0x38e38e39;
          std::vector<float,_std::allocator<float>_>::vector
                    (&areas,(long)(int)uVar37,(allocator_type *)local_3f8);
          if ((int)uVar37 < 1) {
            auVar15._12_4_ = 0;
            auVar15._0_12_ = stack0xfffffffffffffc0c;
            _local_3f8 = auVar15 << 0x20;
          }
          else {
            pfVar32 = &(((objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                         super__Vector_impl_data._M_start)->rect).height;
            uVar43 = 0;
            do {
              areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar43] = pfVar32[-1] * *pfVar32;
              uVar43 = uVar43 + 1;
              pfVar32 = pfVar32 + 0x24;
            } while ((uVar37 & 0x7fffffff) != uVar43);
            auVar14._12_4_ = 0;
            auVar14._0_12_ = stack0xfffffffffffffc0c;
            _local_3f8 = auVar14 << 0x20;
            iVar30 = 0;
            do {
              uVar35 = (uint)((ulong)((long)picked.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)picked.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 2);
              if ((int)uVar35 < 1) {
LAB_0012789a:
                if (picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&picked,
                             (iterator)
                             picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,(int *)local_3f8);
                }
                else {
                  *picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = iVar30;
                  picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              else {
                pOVar49 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                pOVar44 = pOVar49 + iVar30;
                bVar52 = true;
                uVar43 = 0;
                do {
                  iVar40 = picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar43];
                  if (pOVar44->label == pOVar49[iVar40].label) {
                    pOVar48 = pOVar49 + iVar40;
                    uVar38._0_4_ = (pOVar44->rect).x;
                    uVar38._4_4_ = (pOVar44->rect).y;
                    auVar78._8_8_ = 0;
                    auVar78._0_8_ = uVar38;
                    uVar2 = (pOVar44->rect).width;
                    uVar6 = (pOVar44->rect).height;
                    uVar42._0_4_ = (pOVar48->rect).x;
                    uVar42._4_4_ = (pOVar48->rect).y;
                    auVar93._8_8_ = 0;
                    auVar93._0_8_ = uVar42;
                    uVar3 = (pOVar48->rect).width;
                    uVar7 = (pOVar48->rect).height;
                    auVar62._0_4_ = (float)uVar3 + (float)(undefined4)uVar42;
                    auVar62._4_4_ = (float)uVar7 + (float)uVar42._4_4_;
                    auVar62._8_8_ = 0;
                    auVar60 = maxps(auVar93,auVar78);
                    fVar57 = (float)uVar6 + (float)uVar38._4_4_;
                    auVar11[4] = SUB41(fVar57,0);
                    auVar11._0_4_ = (float)uVar2 + (float)(undefined4)uVar38;
                    auVar11[5] = (char)((uint)fVar57 >> 8);
                    auVar11[6] = (char)((uint)fVar57 >> 0x10);
                    auVar11[7] = (char)((uint)fVar57 >> 0x18);
                    auVar11._8_8_ = 0;
                    auVar92 = minps(auVar62,auVar11);
                    fVar57 = auVar92._0_4_ - auVar60._0_4_;
                    fVar54 = auVar92._4_4_ - auVar60._4_4_;
                    fVar53 = 0.0;
                    if (0.0 < fVar57 && 0.0 < fVar54) {
                      fVar53 = fVar57 * fVar54;
                    }
                    if (0.5 < fVar53 / ((areas.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_start[iVar30] +
                                        areas.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start[iVar40]) - fVar53))
                    {
                      bVar52 = false;
                    }
                  }
                  uVar43 = uVar43 + 1;
                } while ((uVar35 & 0x7fffffff) != uVar43);
                if (bVar52) goto LAB_0012789a;
              }
              iVar30 = local_3f8._0_4_ + 1;
              local_3f8._0_4_ = iVar30;
            } while (iVar30 < (int)uVar37);
          }
          if (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (0 < (int)((ulong)((long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 2)) {
            lVar39 = 0;
            do {
              std::vector<Object,_std::allocator<Object>_>::push_back
                        (&objects,(objects_00->super__Vector_base<Object,_std::allocator<Object>_>).
                                  _M_impl.super__Vector_impl_data._M_start +
                                  picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar39]);
              lVar39 = lVar39 + 1;
            } while (lVar39 < (int)((ulong)((long)picked.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)picked.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2));
          }
          if (picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            operator_delete(picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 < (int)((ulong)((long)class_candidates.
                                              super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)class_candidates.
                                             super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555);
      }
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&objects,0,
                   (int)((ulong)((long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 4) * 0x38e38e39 +
                   -1);
      }
      if (200 < (int)((ulong)((long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 4) * 0x38e38e39) {
        std::vector<Object,_std::allocator<Object>_>::resize(&objects,200);
      }
      if (0 < (int)((ulong)((long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl
                                 .super__Vector_impl_data._M_start) >> 4) * 0x38e38e39) {
        lVar31 = 0;
        pOVar49 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          cv::Mat::Mat((Mat *)&areas,local_4b8.h,local_4b8.w,5);
          picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish._0_4_ = 0;
          picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish._4_4_ = 0;
          cv::Mat::operator=((Mat *)&areas,(Scalar_ *)&picked);
          uVar43 = local_238;
          pOVar49 = pOVar49 + lVar31;
          if (0 < (long)local_4b8.c) {
            lVar39 = CONCAT44(local_4b8.data._4_4_,(int)local_4b8.data);
            pfVar58 = (pOVar49->maskdata).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar41 = 0;
            do {
              if (0 < local_4b8.h * local_4b8.w) {
                fVar57 = pfVar58[lVar41];
                uVar38 = 0;
                do {
                  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[uVar38] =
                       *(float *)(lVar39 + uVar38 * 4) * fVar57 +
                       areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage[uVar38];
                  uVar38 = uVar38 + 1;
                } while ((uint)(local_4b8.h * local_4b8.w) != uVar38);
              }
              lVar41 = lVar41 + 1;
              lVar39 = lVar39 + local_4b8.elemsize * local_4b8.cstep;
            } while (lVar41 != local_4b8.c);
          }
          cv::Mat::Mat((Mat *)&picked);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = local_3e8[0]._8_8_;
          local_3e8[0] = auVar16 << 0x40;
          local_3f8._0_4_ = 0x1010000;
          pvStack_3f0 = &areas;
          local_120[0] = 0x2010000;
          local_118._8_8_ = 0;
          local_118._0_8_ = (Mat *)&picked;
          iVar30 = (int)local_458;
          iVar40 = (int)uVar43;
          local_450 = iVar30;
          local_44c = iVar40;
          cv::resize((Mat *)local_3f8,local_120,&local_450);
          cv::Mat::Mat((Mat *)local_3f8,iVar40,iVar30,0);
          cv::Mat::operator=(&pOVar49->mask,(Mat *)local_3f8);
          cv::Mat::~Mat((Mat *)local_3f8);
          _local_3f8 = ZEXT812(0);
          register0x0000120c = 0;
          local_3e8[0] = _local_3f8;
          cv::Mat::operator=(&pOVar49->mask,(Scalar_ *)local_3f8);
          if (0 < iVar40) {
            uVar38 = 0;
            do {
              fVar57 = (pOVar49->rect).y;
              if (((fVar57 <= (float)(int)uVar38) &&
                  ((float)(int)uVar38 <= fVar57 + (pOVar49->rect).height)) && (0 < (int)local_458))
              {
                lVar39 = **(long **)&pOVar49->field_0x78;
                lVar41 = *(long *)&pOVar49->field_0x40;
                lVar46 = *local_4d0;
                uVar42 = 0;
                do {
                  fVar57 = (pOVar49->rect).x;
                  if ((fVar57 <= (float)(int)uVar42) &&
                     ((float)(int)uVar42 <= fVar57 + (pOVar49->rect).width)) {
                    *(char *)(lVar39 * uVar38 + lVar41 + uVar42) =
                         -(0.5 < *(float *)((long)picked.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                           + uVar42 * 4 + lVar46 * uVar38));
                  }
                  uVar42 = uVar42 + 1;
                } while (local_458 != uVar42);
              }
              uVar38 = uVar38 + 1;
            } while (uVar38 != uVar43);
          }
          cv::Mat::~Mat((Mat *)&picked);
          cv::Mat::~Mat((Mat *)&areas);
          lVar31 = lVar31 + 1;
          pOVar49 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (lVar31 < (int)((ulong)((long)objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)objects.
                                             super__Vector_base<Object,_std::allocator<Object>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 4) *
                          0x38e38e39);
      }
      std::
      vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ::~vector(&class_candidates);
      piVar13 = (int *)CONCAT44(iStack_27c,uStack_280);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_268 == (Allocator *)0x0) {
            if ((void *)CONCAT44(iStack_284,baseLine) != (void *)0x0) {
              free((void *)CONCAT44(iStack_284,baseLine));
            }
          }
          else {
            (*local_268->_vptr_Allocator[3])();
          }
        }
      }
      local_248 = 0;
      local_278 = SUB128(ZEXT812(0),4);
      auVar75._8_4_ = 0;
      auVar75._0_8_ = local_278;
      baseLine = 0;
      iStack_284 = 0;
      uStack_280 = 0;
      iStack_270 = 0;
      sStack_258._0_4_ = 0;
      sStack_258._4_4_ = 0;
      local_250 = 0;
      piVar13 = (int *)CONCAT44(local_378.refcount._4_4_,(int)local_378.refcount);
      iStack_27c = baseLine;
      iStack_260 = baseLine;
      iStack_25c = iStack_284;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_378.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_378.data._4_4_,(int)local_378.data) != (void *)0x0) {
              free((void *)CONCAT44(local_378.data._4_4_,(int)local_378.data));
              auVar75._8_4_ = 0;
              auVar75._0_8_ = SUB128(ZEXT812(0),4);
            }
          }
          else {
            (*(local_378.allocator)->_vptr_Allocator[3])();
            auVar75._8_4_ = 0;
            auVar75._0_8_ = SUB128(ZEXT812(0),4);
          }
        }
      }
      local_378.refcount._0_4_ = auVar75._4_4_;
      local_378.elemsize = auVar75._0_8_;
      local_378.elempack = auVar75._8_4_;
      local_378.cstep = 0;
      local_378.c = 0;
      local_378.d = local_378.elempack;
      local_378.h = (int)local_378.refcount;
      local_378.w = 0;
      local_378.dims = 0;
      local_378.refcount._4_4_ = 0;
      local_378.data._4_4_ = 0;
      local_378.data._0_4_ = 0;
      auVar76._8_4_ = 0;
      auVar76._0_8_ = SUB128(ZEXT812(0),4);
      label_size.width = 0;
      label_size.height = 0;
      piVar13 = (int *)CONCAT44(local_2d8.refcount._4_4_,(int)local_2d8.refcount);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_2d8.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_2d8.data._4_4_,(int)local_2d8.data) != (void *)0x0) {
              free((void *)CONCAT44(local_2d8.data._4_4_,(int)local_2d8.data));
              auVar76._8_4_ = 0;
              auVar76._0_8_ = SUB128(ZEXT812(0),4);
            }
          }
          else {
            (*(local_2d8.allocator)->_vptr_Allocator[3])();
            auVar76._8_4_ = 0;
            auVar76._0_8_ = SUB128(ZEXT812(0),4);
          }
        }
      }
      local_2d8.cstep = 0;
      local_2d8.data._0_4_ = 0;
      local_2d8.data._4_4_ = 0;
      local_2d8.refcount._0_4_ = auVar76._4_4_;
      local_2d8.elemsize = auVar76._0_8_;
      local_2d8.elempack = auVar76._8_4_;
      local_2d8._48_8_ = auVar76._4_8_;
      local_2d8.c = 0;
      piVar13 = (int *)CONCAT44(local_4b8.refcount._4_4_,(int)local_4b8.refcount);
      local_2d8.refcount._4_4_ = (int)local_2d8.data;
      local_2d8.dims = (int)local_2d8.data;
      local_2d8.w = local_2d8.data._4_4_;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_4b8.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_4b8.data._4_4_,(int)local_4b8.data) != (void *)0x0) {
              free((void *)CONCAT44(local_4b8.data._4_4_,(int)local_4b8.data));
            }
          }
          else {
            (*(local_4b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_4b8.cstep = 0;
      local_4b8.data._0_4_ = 0;
      local_4b8.data._4_4_ = 0;
      local_4b8.refcount._0_4_ = 0;
      local_4b8.elemsize = SUB128(ZEXT812(0),4);
      local_4b8.elempack = 0;
      local_4b8.h = 0;
      local_4b8.d = 0;
      local_4b8.c = 0;
      local_4b8.refcount._4_4_ = (int)local_4b8.data;
      local_4b8.dims = (int)local_4b8.data;
      local_4b8.w = local_4b8.data._4_4_;
      ncnn::Extractor::~Extractor(&ex);
      if ((vector<int,_std::allocator<int>_> *)local_448.refcount !=
          (vector<int,_std::allocator<int>_> *)0x0) {
        LOCK();
        *(int *)&(((_Vector_base<int,_std::allocator<int>_> *)local_448.refcount)->_M_impl).
                 super__Vector_impl_data._M_start =
             *(int *)&(((_Vector_base<int,_std::allocator<int>_> *)local_448.refcount)->_M_impl).
                      super__Vector_impl_data._M_start + -1;
        UNLOCK();
        if (*(int *)&(((_Vector_base<int,_std::allocator<int>_> *)local_448.refcount)->_M_impl).
                     super__Vector_impl_data._M_start == 0) {
          if (local_448.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_448.data._4_4_,local_448.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_448.data._4_4_,local_448.data._0_4_));
            }
          }
          else {
            (*(local_448.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&yolact);
      cv::Mat::clone();
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        iVar30 = 0;
        uVar43 = 0;
        do {
          if (0.15 <= (double)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar43].prob) {
            pOVar49 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar43;
            dVar12 = (double)(pOVar49->rect).y;
            uVar85 = SUB81(dVar12,0);
            uVar87 = (char)((ulong)dVar12 >> 8);
            uVar89 = (char)((ulong)dVar12 >> 0x10);
            uVar24 = (char)((ulong)dVar12 >> 0x18);
            uVar25 = (char)((ulong)dVar12 >> 0x20);
            uVar26 = (char)((ulong)dVar12 >> 0x28);
            uVar27 = (char)((ulong)dVar12 >> 0x30);
            uVar28 = (char)((ulong)dVar12 >> 0x38);
            fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                    (double)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar43].prob,(double)(pOVar49->rect).x,
                    CONCAT17(uVar88,CONCAT16(uVar86,CONCAT15(uVar84,CONCAT14(uVar83,CONCAT13(uVar82,
                                                  CONCAT12(uVar81,CONCAT11(uVar80,uVar79))))))),
                    (double)(pOVar49->rect).width,SUB84((double)(pOVar49->rect).height,0),
                    pOVar49->label);
            uVar88 = uVar28;
            uVar86 = uVar27;
            uVar84 = uVar26;
            uVar83 = uVar25;
            uVar82 = uVar24;
            uVar81 = uVar89;
            uVar80 = uVar87;
            uVar79 = uVar85;
            auVar92 = _local_3f8;
            uVar37 = CONCAT13(uVar82,CONCAT12(uVar81,CONCAT11(uVar80,uVar79))) ^
                     CONCAT13(uVar82,CONCAT12(uVar81,CONCAT11(uVar80,uVar79)));
            uVar35 = CONCAT13(uVar88,CONCAT12(uVar86,CONCAT11(uVar84,uVar83))) ^
                     CONCAT13(uVar88,CONCAT12(uVar86,CONCAT11(uVar84,uVar83)));
            uVar85 = (undefined1)(uVar35 >> 8);
            uVar87 = (undefined1)(uVar35 >> 0x10);
            uVar89 = (undefined1)(uVar35 >> 0x18);
            pvStack_3f0._4_1_ = (char)uVar35;
            pvStack_3f0._0_4_ = uVar37;
            pvStack_3f0._5_1_ = uVar85;
            pvStack_3f0._6_1_ = uVar87;
            pvStack_3f0._7_1_ = uVar89;
            local_3f8 = auVar92._0_8_;
            auVar17._8_8_ = 0;
            auVar17._0_8_ = local_3e8[0]._8_8_;
            local_3e8[0] = auVar17 << 0x40;
            local_3f8._0_4_ = 0x3010000;
            local_4b8.data._0_4_ = (int)ROUND((pOVar49->rect).x);
            local_4b8.data._4_4_ = (uint)ROUND((pOVar49->rect).y);
            lVar31 = (long)(iVar30 + ((int)((long)iVar30 / 0x51 + ((long)iVar30 >> 0x3f)) -
                                     (iVar30 >> 0x1f)) * -0x51) * 3;
            local_4b8.refcount._0_4_ = (int)ROUND((pOVar49->rect).width);
            local_4b8.refcount._4_4_ = (int)ROUND((pOVar49->rect).height);
            bVar8 = draw_objects(cv::Mat_const&,std::vector<Object,std::allocator<Object>>const&)::
                    colors[lVar31 + 2];
            uVar9 = *(undefined2 *)
                     (draw_objects(cv::Mat_const&,std::vector<Object,std::allocator<Object>>const&)
                      ::colors + lVar31);
            auVar71._0_15_ = ZEXT415(0);
            auVar71[0xf] = uVar89;
            auVar70._14_2_ = auVar71._14_2_;
            auVar70._0_13_ = ZEXT413(0);
            auVar70[0xd] = uVar87;
            auVar69._13_3_ = auVar70._13_3_;
            auVar69._0_13_ = ZEXT413(0);
            auVar68._12_4_ = auVar69._12_4_;
            auVar68._0_11_ = ZEXT411(0);
            auVar68[0xb] = uVar85;
            auVar67._11_5_ = auVar68._11_5_;
            auVar67._0_11_ = ZEXT411(0);
            auVar66._10_6_ = auVar67._10_6_;
            auVar66._0_9_ = (unkuint9)0;
            auVar66[9] = (char)uVar35;
            auVar65._9_7_ = auVar66._9_7_;
            auVar65._0_9_ = (unkuint9)0;
            auVar19._1_8_ = auVar65._8_8_;
            auVar19[0] = (char)(uVar37 >> 0x18);
            auVar19._9_7_ = 0;
            auVar18._1_10_ = SUB1610(auVar19 << 0x38,6);
            auVar18[0] = (char)(uVar37 >> 0x10);
            auVar18._11_5_ = 0;
            auVar64._4_12_ = SUB1612(auVar18 << 0x28,4);
            auVar64[3] = (char)(uVar37 >> 8);
            auVar64[2] = (char)((ushort)uVar9 >> 8);
            auVar64._0_2_ = uVar9;
            auVar63._2_14_ = auVar64._2_14_;
            uVar95 = CONCAT11((char)uVar37,(char)uVar9);
            auVar74._0_12_ = auVar63._0_12_;
            auVar74._12_2_ = SUB162(auVar19 << 0x38,6);
            auVar74._14_2_ = (short)(uVar35 >> 0x10);
            auVar73._12_4_ = auVar74._12_4_;
            auVar73._0_10_ = auVar63._0_10_;
            auVar73._10_2_ = (short)uVar35;
            auVar72._10_6_ = auVar73._10_6_;
            auVar72._0_8_ = auVar63._0_8_;
            auVar72._8_2_ = SUB162(auVar18 << 0x28,4);
            auVar20._4_8_ = auVar72._8_8_;
            auVar20._2_2_ = (short)(uVar37 >> 0x10);
            auVar20._0_2_ = auVar64._2_2_;
            pfVar58 = (pointer)(double)CONCAT22((short)uVar37,uVar95);
            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)(double)auVar20._0_4_;
            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start = pfVar58;
            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)(double)bVar8;
            pvStack_3f0 = (vector<float,_std::allocator<float>_> *)&picked;
            cv::rectangle((string *)local_3f8,&local_4b8,&areas,1,8,0);
            sprintf((char *)&areas,"%s %.1f%%",(double)(pOVar49->prob * 100.0),
                    _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                    *(int *)(
                            _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                            + (long)pOVar49->label * 4));
            baseLine = 0;
            local_3f8 = (undefined1  [8])local_3e8;
            sVar33 = strlen((char *)&areas);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3f8,&areas,
                       (long)&areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start + sVar33);
            cv::getTextSize((string *)&label_size,(int)(string *)local_3f8,0.5,0,(int *)0x1);
            piVar23 = picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (local_3f8 != (undefined1  [8])local_3e8) {
              operator_delete((void *)local_3f8);
              piVar23 = picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish._4_4_ = (int)((ulong)piVar23 >> 0x20);
            iVar40 = (int)(pOVar49->rect).x;
            iVar45 = (int)(((pOVar49->rect).y - (float)label_size.height) - (float)baseLine);
            if (iVar45 < 1) {
              iVar45 = 0;
            }
            iVar50 = picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish._4_4_ - label_size.width;
            if (label_size.width + iVar40 <=
                picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_finish._4_4_) {
              iVar50 = iVar40;
            }
            local_448.elemsize = 0;
            local_448.data._0_4_ = 0x3010000;
            local_2d8.refcount._4_4_ = baseLine + label_size.height;
            local_2d8.refcount._0_4_ = label_size.width;
            _local_3f8 = _DAT_005f1050;
            local_3e8[0] = ZEXT816(0x406fe00000000000);
            local_448.refcount = (int *)&picked;
            local_2d8.data._0_4_ = iVar50;
            local_2d8.data._4_4_ = iVar45;
            picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = piVar23;
            cv::rectangle(&local_448,&local_2d8,(string *)local_3f8,0xffffffff,8,0);
            local_448.elemsize = 0;
            local_448.data._0_4_ = 0x3010000;
            local_3f8 = (undefined1  [8])local_3e8;
            local_448.refcount = (int *)&picked;
            sVar33 = strlen((char *)&areas);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3f8,&areas,
                       (long)&areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start + sVar33);
            local_378.data._4_4_ = iVar45 + label_size.height;
            yolact._0_12_ = ZEXT812(0);
            yolact.opt.num_threads = 0;
            local_378.data._0_4_ = iVar50;
            yolact.opt._8_16_ = yolact._0_16_;
            cv::putText(0x3fe0000000000000,&local_448,(string *)local_3f8,&local_378,0,&yolact);
            piVar23 = picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (local_3f8 != (undefined1  [8])local_3e8) {
              operator_delete((void *)local_3f8);
              piVar23 = picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish._4_4_ = (int)((ulong)piVar23 >> 0x20);
            picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish._0_4_ = (int)piVar23;
            if (0 < (int)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish) {
              lVar31 = 0;
              do {
                if (0xffffffff < (long)piVar23) {
                  lVar39 = **(long **)&pOVar49->field_0x78;
                  lVar41 = *(long *)&pOVar49->field_0x40;
                  pbVar36 = (byte *)((long)picked.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage +
                                    *local_4d0 * lVar31 + 2);
                  lVar46 = 0;
                  do {
                    if (*(char *)(lVar39 * lVar31 + lVar41 + lVar46) == -1) {
                      iVar40 = (int)ROUND((double)pbVar36[-2] * 0.5 + (double)pfVar58 * 0.5);
                      if (iVar40 < 1) {
                        iVar40 = 0;
                      }
                      if (0xfe < iVar40) {
                        iVar40 = 0xff;
                      }
                      pbVar36[-2] = (byte)iVar40;
                      iVar40 = (int)ROUND((double)pbVar36[-1] * 0.5 + (double)auVar20._0_4_ * 0.5);
                      if (iVar40 < 1) {
                        iVar40 = 0;
                      }
                      if (0xfe < iVar40) {
                        iVar40 = 0xff;
                      }
                      pbVar36[-1] = (byte)iVar40;
                      iVar40 = (int)ROUND((double)*pbVar36 * 0.5 + (double)bVar8 * 0.5);
                      if (iVar40 < 1) {
                        iVar40 = 0;
                      }
                      if (0xfe < iVar40) {
                        iVar40 = 0xff;
                      }
                      *pbVar36 = (byte)iVar40;
                    }
                    lVar46 = lVar46 + 1;
                    pbVar36 = pbVar36 + 3;
                  } while (lVar46 < picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish._4_4_);
                }
                lVar31 = lVar31 + 1;
              } while (lVar31 < (int)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish);
            }
            iVar30 = iVar30 + 1;
            picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = piVar23;
          }
          uVar43 = uVar43 + 1;
        } while (uVar43 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                 -0x71c71c71c71c71c7));
      }
      ppfVar1 = &areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x702e746c75736572;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0xa;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)ppfVar1;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_3e8[0]._8_8_;
      local_3e8[0] = auVar21 << 0x40;
      local_3f8._0_4_ = 0x1010000;
      pvStack_3f0 = (vector<float,_std::allocator<float>_> *)&picked;
      local_448.elemsize = 0;
      local_448.data._0_4_ = 0;
      local_448.data._4_4_ = 0;
      local_448.refcount = (int *)0x0;
      cv::imwrite((string *)&areas,(_InputArray *)local_3f8,(vector *)&local_448);
      if ((void *)CONCAT44(local_448.data._4_4_,local_448.data._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_448.data._4_4_,local_448.data._0_4_));
      }
      if ((pointer *)
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start != ppfVar1) {
        operator_delete(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)CONCAT26(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._6_2_,0x6567616d69);
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x5;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)ppfVar1;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_3e8[0]._8_8_;
      local_3e8[0] = auVar22 << 0x40;
      local_3f8._0_4_ = 0x1010000;
      cv::imshow((string *)&areas,(_InputArray *)local_3f8);
      if ((pointer *)
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start != ppfVar1) {
        operator_delete(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar30 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&picked);
      std::vector<Object,_std::allocator<Object>_>::~vector(&objects);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar10);
      iVar30 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar30 = -1;
  }
  return iVar30;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_yolact(m, objects);

    draw_objects(m, objects);

    return 0;
}